

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::detail::resolveSymlink(path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  ssize_t sVar2;
  format fmt;
  size_type __n;
  error_code eVar3;
  vector<char,_std::allocator<char>_> buffer;
  allocator_type local_79;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  error_code *local_70;
  _Vector_base<char,_std::allocator<char>_> local_68;
  string_type local_50;
  
  local_78 = &(__return_storage_ptr__->_path).field_2;
  __n = 0x100;
  local_70 = ec;
  do {
    local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffffff00;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_68,__n,(value_type *)&local_50,
               &local_79);
    sVar2 = readlink((p->_path)._M_dataplus._M_p,local_68._M_impl.super__Vector_impl_data._M_start,
                     (long)local_68._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_68._M_impl.super__Vector_impl_data._M_start);
    if (sVar2 < 0) {
      bVar1 = false;
      eVar3 = make_system_error(0);
      local_70->_M_value = eVar3._M_value;
      local_70->_M_cat = eVar3._M_cat;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_78;
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    }
    else if (sVar2 < (int)__n) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,local_68._M_impl.super__Vector_impl_data._M_start,
                 local_68._M_impl.super__Vector_impl_data._M_start + sVar2);
      path::path(__return_storage_ptr__,&local_50,fmt);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = false;
    }
    else {
      __n = __n * 2;
      bVar1 = true;
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_68);
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path resolveSymlink(const path& p, std::error_code& ec)
{
#ifdef GHC_OS_WINDOWS
#ifndef REPARSE_DATA_BUFFER_HEADER_SIZE
    typedef struct _REPARSE_DATA_BUFFER
    {
        ULONG ReparseTag;
        USHORT ReparseDataLength;
        USHORT Reserved;
        union
        {
            struct
            {
                USHORT SubstituteNameOffset;
                USHORT SubstituteNameLength;
                USHORT PrintNameOffset;
                USHORT PrintNameLength;
                ULONG Flags;
                WCHAR PathBuffer[1];
            } SymbolicLinkReparseBuffer;
            struct
            {
                USHORT SubstituteNameOffset;
                USHORT SubstituteNameLength;
                USHORT PrintNameOffset;
                USHORT PrintNameLength;
                WCHAR PathBuffer[1];
            } MountPointReparseBuffer;
            struct
            {
                UCHAR DataBuffer[1];
            } GenericReparseBuffer;
        } DUMMYUNIONNAME;
    } REPARSE_DATA_BUFFER;
#ifndef MAXIMUM_REPARSE_DATA_BUFFER_SIZE
#define MAXIMUM_REPARSE_DATA_BUFFER_SIZE (16 * 1024)
#endif
#endif

    std::shared_ptr<void> file(CreateFileW(p.wstring().c_str(), 0, FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE, 0, OPEN_EXISTING, FILE_FLAG_OPEN_REPARSE_POINT | FILE_FLAG_BACKUP_SEMANTICS, 0), CloseHandle);
    if (file.get() == INVALID_HANDLE_VALUE) {
        ec = detail::make_system_error();
        return path();
    }

    std::shared_ptr<REPARSE_DATA_BUFFER> reparseData((REPARSE_DATA_BUFFER*)std::calloc(1, MAXIMUM_REPARSE_DATA_BUFFER_SIZE), std::free);
    ULONG bufferUsed;
    path result;
    if (DeviceIoControl(file.get(), FSCTL_GET_REPARSE_POINT, 0, 0, reparseData.get(), MAXIMUM_REPARSE_DATA_BUFFER_SIZE, &bufferUsed, 0)) {
        if (IsReparseTagMicrosoft(reparseData->ReparseTag)) {
            switch (reparseData->ReparseTag) {
                case IO_REPARSE_TAG_SYMLINK:
                    result = std::wstring(&reparseData->SymbolicLinkReparseBuffer.PathBuffer[reparseData->SymbolicLinkReparseBuffer.PrintNameOffset / sizeof(WCHAR)], reparseData->SymbolicLinkReparseBuffer.PrintNameLength / sizeof(WCHAR));
                    break;
                case IO_REPARSE_TAG_MOUNT_POINT:
                    result = std::wstring(&reparseData->MountPointReparseBuffer.PathBuffer[reparseData->MountPointReparseBuffer.PrintNameOffset / sizeof(WCHAR)], reparseData->MountPointReparseBuffer.PrintNameLength / sizeof(WCHAR));
                    break;
                default:
                    break;
            }
        }
    }
    else {
        ec = detail::make_system_error();
    }
    return result;
#else
    size_t bufferSize = 256;
    while (true) {
        std::vector<char> buffer(bufferSize, static_cast<char>(0));
        auto rc = ::readlink(p.c_str(), buffer.data(), buffer.size());
        if (rc < 0) {
            ec = detail::make_system_error();
            return path();
        }
        else if (rc < static_cast<int>(bufferSize)) {
            return path(std::string(buffer.data(), static_cast<std::string::size_type>(rc)));
        }
        bufferSize *= 2;
    }
    return path();
#endif
}